

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O2

void __thiscall QRhiWidgetPrivate::resetColorBufferObjects(QRhiWidgetPrivate *this)

{
  if ((parameter_type)this->colorTexture != (parameter_type)0x0) {
    QList<QRhiResource_*>::append(&this->pendingDeletes,(parameter_type)this->colorTexture);
    this->colorTexture = (QRhiTexture *)0x0;
  }
  if ((parameter_type)this->msaaColorBuffer != (parameter_type)0x0) {
    QList<QRhiResource_*>::append(&this->pendingDeletes,(parameter_type)this->msaaColorBuffer);
    this->msaaColorBuffer = (QRhiRenderBuffer *)0x0;
  }
  if ((parameter_type)this->resolveTexture != (parameter_type)0x0) {
    QList<QRhiResource_*>::append(&this->pendingDeletes,(parameter_type)this->resolveTexture);
    this->resolveTexture = (QRhiTexture *)0x0;
  }
  return;
}

Assistant:

void QRhiWidgetPrivate::resetColorBufferObjects()
{
    if (colorTexture) {
        pendingDeletes.append(colorTexture);
        colorTexture = nullptr;
    }
    if (msaaColorBuffer) {
        pendingDeletes.append(msaaColorBuffer);
        msaaColorBuffer = nullptr;
    }
    if (resolveTexture) {
        pendingDeletes.append(resolveTexture);
        resolveTexture = nullptr;
    }
}